

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<48u,unsigned_short,void,false>::wr_string<char*>
          (uintwide_t<48u,unsigned_short,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  ulong uVar3;
  bool bVar4;
  unsigned_short uVar5;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar6;
  size_type_conflict sVar7;
  const_iterator puVar8;
  byte *pbVar9;
  reference pcVar10;
  size_type sVar11;
  pointer pcVar12;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  undefined5 extraout_var;
  reference pcVar13;
  pointer pcVar14;
  char local_131;
  unsigned_long local_d8;
  unsigned_fast_type local_d0;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<24U,_unsigned_char,_void,_false> t_2;
  uintwide_t<48U,_unsigned_short,_void,_false> local_94 [4];
  value_type local_90 [2];
  undefined4 local_8e;
  undefined2 local_8a;
  uintwide_t<24U,_unsigned_char,_void,_false> local_88;
  value_type vStack_85;
  value_type local_84 [4];
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  byte local_49;
  ulong uStack_48;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type_conflict mask;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  mask._1_1_ = true;
  if (base_rep == '\b') {
    str_temp.super_array<char,_24UL>.elems._18_4_ = *(undefined4 *)this;
    str_temp.super_array<char,_24UL>.elems._22_2_ = *(undefined2 *)(this + 4);
    str_temp.super_array<char,_24UL>.elems[0x10] = '\a';
    str_temp.super_array<char,_24UL>.elems[0x11] = '\0';
    memset((void *)((long)&pos + 2),0,0x18);
    detail::fixed_static_array<char,_24U>::fixed_static_array
              ((fixed_static_array<char,_24U> *)((long)&pos + 2));
    sVar7 = detail::fixed_static_array<char,_24U>::static_size();
    uStack_48 = (ulong)(sVar7 - 1);
    bVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero
                      ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                       (str_temp.super_array<char,_24UL>.elems + 0x12));
    if (bVar4) {
      uStack_48 = uStack_48 - 1;
      pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)((long)&pos + 2),
                           (size_type_conflict)uStack_48);
      *pcVar10 = '0';
    }
    else {
      while (bVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero
                               ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                                (str_temp.super_array<char,_24UL>.elems + 0x12)),
            !bVar4 && 0 < (long)uStack_48) {
        puVar8 = detail::array_detail::array<unsigned_short,_3UL>::cbegin
                           ((array<unsigned_short,_3UL> *)
                            (str_temp.super_array<char,_24UL>.elems + 0x12));
        local_49 = (byte)*puVar8 & 7;
        if (local_49 < 9) {
          local_49 = local_49 + 0x30;
        }
        uStack_48 = uStack_48 - 1;
        pbVar9 = (byte *)detail::fixed_static_array<char,_24U>::operator[]
                                   ((fixed_static_array<char,_24U> *)((long)&pos + 2),
                                    (size_type_conflict)uStack_48);
        *pbVar9 = local_49;
        operator>>=((uintwide_t<48u,unsigned_short,void,false> *)
                    (str_temp.super_array<char,_24UL>.elems + 0x12),3);
      }
    }
    if ((show_base) && (0 < (long)uStack_48)) {
      uStack_48 = uStack_48 - 1;
      pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)((long)&pos + 2),
                           (size_type_conflict)uStack_48);
      *pcVar10 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_48)) {
      uStack_48 = uStack_48 - 1;
      pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)((long)&pos + 2),
                           (size_type_conflict)uStack_48);
      *pcVar10 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_24UL>::size();
      register0x00000000 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_1.super_array<char,_24UL>.elems + 0x17));
      while (sVar11 = detail::array_detail::array<char,_24UL>::size(), cVar1 = fill_char_str,
            (long)((sVar11 - 1) - field_width) < (long)uStack_48) {
        uStack_48 = uStack_48 - 1;
        pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                            ((fixed_static_array<char,_24U> *)((long)&pos + 2),
                             (size_type_conflict)uStack_48);
        *pcVar10 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_24UL>::size();
    pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                        ((fixed_static_array<char,_24U> *)((long)&pos + 2),(int)sVar11 - 1);
    *pcVar10 = '\0';
    pcVar12 = detail::array_detail::array<char,_24UL>::data((array<char,_24UL> *)((long)&pos + 2));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar12 + uStack_48);
  }
  else if (base_rep == '\n') {
    str_temp_1.super_array<char,_24UL>.elems._17_4_ = *(undefined4 *)this;
    str_temp_1.super_array<char,_24UL>.elems._21_2_ = *(undefined2 *)(this + 4);
    str_temp_1.super_array<char,_24UL>.elems[0x10] = '\0';
    memset((void *)((long)&pos_1 + 1),0,0x18);
    detail::fixed_static_array<char,_24U>::fixed_static_array
              ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1));
    sVar7 = detail::fixed_static_array<char,_24U>::static_size();
    _tmp = (ulong)(sVar7 - 1);
    bVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero
                      ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                       (str_temp_1.super_array<char,_24UL>.elems + 0x11));
    if (bVar4) {
      _tmp = _tmp - 1;
      pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1),
                           (size_type_conflict)_tmp);
      *pcVar10 = '0';
    }
    else {
      while (bVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero
                               ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                                (str_temp_1.super_array<char,_24UL>.elems + 0x11)),
            !bVar4 && 0 < (long)_tmp) {
        local_84[0] = str_temp_1.super_array<char,_24UL>.elems[0x15];
        local_84[1] = str_temp_1.super_array<char,_24UL>.elems[0x16];
        local_88.values.super_array<unsigned_char,_3UL>.elems[0] =
             str_temp_1.super_array<char,_24UL>.elems[0x11];
        local_88.values.super_array<unsigned_char,_3UL>.elems[1] =
             str_temp_1.super_array<char,_24UL>.elems[0x12];
        local_88.values.super_array<unsigned_char,_3UL>.elems[2] =
             str_temp_1.super_array<char,_24UL>.elems[0x13];
        vStack_85 = str_temp_1.super_array<char,_24UL>.elems[0x14];
        uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                   (str_temp_1.super_array<char,_24UL>.elems + 0x11),10,0,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        local_90[0] = str_temp_1.super_array<char,_24UL>.elems[0x15];
        local_90[1] = str_temp_1.super_array<char,_24UL>.elems[0x16];
        local_94[0] = (uintwide_t<48U,_unsigned_short,_void,_false>)
                      str_temp_1.super_array<char,_24UL>.elems[0x11];
        local_94[1] = (uintwide_t<48U,_unsigned_short,_void,_false>)
                      str_temp_1.super_array<char,_24UL>.elems[0x12];
        local_94[2] = (uintwide_t<48U,_unsigned_short,_void,_false>)
                      str_temp_1.super_array<char,_24UL>.elems[0x13];
        local_94[3] = (uintwide_t<48U,_unsigned_short,_void,_false>)
                      str_temp_1.super_array<char,_24UL>.elems[0x14];
        v = uintwide_t<48U,_unsigned_short,_void,_false>::mul_by_limb(local_94,10);
        uVar6 = wide_integer::operator-(&local_88,v);
        local_8e = (undefined4)
                   CONCAT53(extraout_var,uVar6.values.super_array<unsigned_char,_3UL>.elems);
        local_8a = (undefined2)((uint5)extraout_var >> 8);
        uVar5 = wide_integer::uintwide_t::operator_cast_to_unsigned_short((uintwide_t *)&local_8e);
        _tmp = _tmp - 1;
        pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                            ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1),
                             (size_type_conflict)_tmp);
        *pcVar10 = (char)uVar5 + '0';
      }
    }
    if ((0 < (long)_tmp) && (show_pos)) {
      _tmp = _tmp - 1;
      pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                          ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1),
                           (size_type_conflict)_tmp);
      *pcVar10 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_24UL>::size();
      register0x00000000 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_2.super_array<char,_20UL>.elems + 0x12));
      while (uVar3 = _tmp, sVar11 = detail::array_detail::array<char,_24UL>::size(),
            cVar1 = fill_char_str, (long)((sVar11 - 1) - field_width) < (long)uVar3) {
        _tmp = _tmp - 1;
        pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                            ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1),
                             (size_type_conflict)_tmp);
        *pcVar10 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_24UL>::size();
    pcVar10 = detail::fixed_static_array<char,_24U>::operator[]
                        ((fixed_static_array<char,_24U> *)((long)&pos_1 + 1),(int)sVar11 - 1);
    *pcVar10 = '\0';
    pcVar12 = detail::array_detail::array<char,_24UL>::data((array<char,_24UL> *)((long)&pos_1 + 1))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar12 + _tmp);
  }
  else if (base_rep == '\x10') {
    str_temp_2.super_array<char,_20UL>.elems._12_4_ = *(undefined4 *)this;
    str_temp_2.super_array<char,_20UL>.elems._16_2_ = *(undefined2 *)(this + 4);
    memset((void *)((long)&pos_2 + 6),0,0x14);
    detail::fixed_static_array<char,_20U>::fixed_static_array
              ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6));
    sVar7 = detail::fixed_static_array<char,_20U>::static_size();
    dst = (unsigned_fast_type)(sVar7 - 1);
    bVar4 = uintwide_t<48U,_unsigned_short,_void,_false>::is_zero
                      ((uintwide_t<48U,_unsigned_short,_void,_false> *)
                       (str_temp_2.super_array<char,_20UL>.elems + 0xc));
    if (bVar4) {
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                          ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                           (size_type_conflict)dst);
      *pcVar13 = '0';
    }
    else {
      pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                          ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                           (size_type_conflict)dst);
      local_d0 = uintwide_t<48U,_unsigned_short,_void,_false>::extract_hex_digits<false,_nullptr>
                           ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                            (str_temp_2.super_array<char,_20UL>.elems + 0xc),pcVar13,is_uppercase);
      dst = dst - local_d0;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_131 = 'X';
      if (!is_uppercase) {
        local_131 = 'x';
      }
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                          ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                           (size_type_conflict)dst);
      *pcVar13 = local_131;
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                          ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                           (size_type_conflict)dst);
      *pcVar13 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                          ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                           (size_type_conflict)dst);
      *pcVar13 = '+';
    }
    if (field_width != 0) {
      sVar11 = detail::array_detail::array<char,_20UL>::size();
      local_d8 = sVar11 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_d8);
      while (uVar2 = dst, sVar11 = detail::array_detail::array<char,_20UL>::size(),
            cVar1 = fill_char_str, (long)((sVar11 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                            ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),
                             (size_type_conflict)dst);
        *pcVar13 = cVar1;
      }
    }
    sVar11 = detail::array_detail::array<char,_20UL>::size();
    pcVar13 = detail::fixed_static_array<char,_20U>::operator[]
                        ((fixed_static_array<char,_20U> *)((long)&pos_2 + 6),(int)sVar11 - 1);
    *pcVar13 = '\0';
    pcVar14 = detail::array_detail::array<char,_20UL>::data((array<char,_20UL> *)((long)&pos_2 + 6))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar14 + dst);
  }
  else {
    mask._1_1_ = false;
  }
  return mask._1_1_;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }